

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

SquareMatrix<3> * __thiscall
pbrt::SquareMatrix<3>::operator/
          (SquareMatrix<3> *__return_storage_ptr__,SquareMatrix<3> *this,Float s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  SquareMatrix<3> *pSVar4;
  int i;
  long lVar5;
  long lVar6;
  
  pSVar4 = __return_storage_ptr__;
  __return_storage_ptr__->m[2][2] = this->m[2][2];
  uVar1 = *(undefined8 *)(this->m[0] + 2);
  uVar2 = *(undefined8 *)(this->m[1] + 1);
  uVar3 = *(undefined8 *)this->m[2];
  *(undefined8 *)__return_storage_ptr__->m[0] = *(undefined8 *)this->m[0];
  *(undefined8 *)(__return_storage_ptr__->m[0] + 2) = uVar1;
  *(undefined8 *)(__return_storage_ptr__->m[1] + 1) = uVar2;
  *(undefined8 *)__return_storage_ptr__->m[2] = uVar3;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      (*(Float (*) [3])*(Float (*) [3])__return_storage_ptr__)[lVar6] =
           (*(Float (*) [3])*(Float (*) [3])__return_storage_ptr__)[lVar6] / s;
    }
    __return_storage_ptr__ = (SquareMatrix<3> *)((long)__return_storage_ptr__ + 0xc);
  }
  return pSVar4;
}

Assistant:

operator/(Float s) const {
        DCHECK_NE(s, 0);
        SquareMatrix r = *this;
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                r.m[i][j] /= s;
        return r;
    }